

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O1

void GEN_CS::call_cs_ldf<false>
               (multi_learner *base,multi_ex *examples,v_array<CB::label> *cb_labels,
               label *cs_labels,v_array<COST_SENSITIVE::label> *prepped_cs_labels,uint64_t offset,
               size_t id)

{
  uint64_t *puVar1;
  label_t *plVar2;
  wclass **ppwVar3;
  undefined8 *puVar4;
  int iVar5;
  pointer ppeVar6;
  uint64_t uVar7;
  example *peVar8;
  label_t lVar9;
  label_t lVar10;
  size_t sVar11;
  pointer ppeVar12;
  long lVar13;
  multi_ex *__range1;
  ulong uVar14;
  iterator __begin2;
  multi_ex *__range2;
  
  v_array<CB::label>::clear(cb_labels);
  uVar14 = ((long)(cs_labels->costs)._end - (long)(cs_labels->costs)._begin >> 4) + 1;
  if ((ulong)((long)prepped_cs_labels->_end - (long)prepped_cs_labels->_begin >> 5) < uVar14) {
    v_array<COST_SENSITIVE::label>::resize(prepped_cs_labels,uVar14);
    prepped_cs_labels->_end = prepped_cs_labels->end_array;
  }
  ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = ((*ppeVar12)->super_example_predict).ft_offset;
  if (ppeVar12 != ppeVar6) {
    lVar13 = 0;
    do {
      peVar8 = *ppeVar12;
      v_array<CB::label>::push_back(cb_labels,&(peVar8->l).cb);
      v_array<COST_SENSITIVE::wclass>::clear(&prepped_cs_labels->_begin[lVar13].costs);
      v_array<COST_SENSITIVE::wclass>::push_back
                (&prepped_cs_labels->_begin[lVar13].costs,(cs_labels->costs)._begin + lVar13);
      plVar2 = (label_t *)(prepped_cs_labels->_begin + lVar13);
      lVar9 = *plVar2;
      lVar10 = plVar2[1];
      ppwVar3 = &prepped_cs_labels->_begin[lVar13].costs.end_array;
      sVar11 = (size_t)ppwVar3[1];
      (peVar8->l).cs.costs.end_array = *ppwVar3;
      (peVar8->l).cs.costs.erase_count = sVar11;
      (peVar8->l).multi = lVar9;
      (peVar8->l).cs.costs._end = (wclass *)lVar10;
      (peVar8->super_example_predict).ft_offset = offset;
      ppeVar12 = ppeVar12 + 1;
      lVar13 = lVar13 + 1;
    } while (ppeVar12 != ppeVar6);
  }
  ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar12 != ppeVar6) {
    iVar5 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar12)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(iVar5 * (int)id);
      ppeVar12 = ppeVar12 + 1;
    } while (ppeVar12 != ppeVar6);
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),examples);
  ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar12 != ppeVar6) {
    iVar5 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar12)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)((int)id * iVar5);
      ppeVar12 = ppeVar12 + 1;
    } while (ppeVar12 != ppeVar6);
  }
  ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar12) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      peVar8 = ppeVar12[uVar14];
      plVar2 = (label_t *)((long)&(cb_labels->_begin->costs)._begin + lVar13);
      lVar9 = *plVar2;
      lVar10 = plVar2[1];
      puVar4 = (undefined8 *)((long)&(cb_labels->_begin->costs).end_array + lVar13);
      sVar11 = puVar4[1];
      (peVar8->l).cs.costs.end_array = (wclass *)*puVar4;
      (peVar8->l).cs.costs.erase_count = sVar11;
      (peVar8->l).multi = lVar9;
      (peVar8->l).cs.costs._end = (wclass *)lVar10;
      ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
       super__Vector_impl_data._M_start[uVar14]->super_example_predict).ft_offset = uVar7;
      uVar14 = uVar14 + 1;
      ppeVar12 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar14 < (ulong)((long)(examples->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar12 >> 3)
            );
  }
  return;
}

Assistant:

void call_cs_ldf(LEARNER::multi_learner& base, multi_ex& examples, v_array<CB::label>& cb_labels,
    COST_SENSITIVE::label& cs_labels, v_array<COST_SENSITIVE::label>& prepped_cs_labels, uint64_t offset, size_t id = 0)
{
  cb_labels.clear();
  if (prepped_cs_labels.size() < cs_labels.costs.size() + 1)
  {
    prepped_cs_labels.resize(cs_labels.costs.size() + 1);
    prepped_cs_labels.end() = prepped_cs_labels.end_array;
  }

  // 1st: save cb_label (into mydata) and store cs_label for each example, which will be passed into base.learn.
  // also save offsets
  uint64_t saved_offset = examples[0]->ft_offset;
  size_t index = 0;
  for (auto ec : examples)
  {
    cb_labels.push_back(ec->l.cb);
    prepped_cs_labels[index].costs.clear();
    prepped_cs_labels[index].costs.push_back(cs_labels.costs[index]);
    ec->l.cs = prepped_cs_labels[index++];
    ec->ft_offset = offset;
  }

  // 2nd: predict for each ex
  // // call base.predict for all examples
  if (is_learn)
    base.learn(examples, (int32_t)id);
  else
    base.predict(examples, (int32_t)id);

  // 3rd: restore cb_label for each example
  // (**ec).l.cb = array.element.
  // and restore offsets
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->l.cb = cb_labels[i];
    examples[i]->ft_offset = saved_offset;
  }
}